

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O0

Gia_Man_t * Gia_ManSpecReduceTrace(Gia_Man_t *p,Vec_Int_t *vTrace,Vec_Int_t *vMap)

{
  int iVar1;
  uint uVar2;
  Vec_Int_t *vXorLits_00;
  Gia_Man_t *p_00;
  char *pcVar3;
  Gia_Obj_t *pGVar4;
  bool bVar5;
  int local_4c;
  int iLitNew;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *pTemp;
  Gia_Man_t *pNew;
  Vec_Int_t *vXorLits;
  Vec_Int_t *vMap_local;
  Vec_Int_t *vTrace_local;
  Gia_Man_t *p_local;
  
  if (p->pReprs == (Gia_Rpr_t *)0x0) {
    Abc_Print(1,"Gia_ManSpecReduce(): Equivalence classes are not available.\n");
    p_local = (Gia_Man_t *)0x0;
  }
  else {
    Vec_IntClear(vTrace);
    vXorLits_00 = Vec_IntAlloc(1000);
    Gia_ManSetPhase(p);
    Gia_ManFillValue(p);
    iVar1 = Gia_ManObjNum(p);
    p_00 = Gia_ManStart(iVar1);
    pcVar3 = Abc_UtilStrsav(p->pName);
    p_00->pName = pcVar3;
    pcVar3 = Abc_UtilStrsav(p->pSpec);
    p_00->pSpec = pcVar3;
    Gia_ManHashAlloc(p_00);
    pGVar4 = Gia_ManConst0(p);
    pGVar4->Value = 0;
    local_4c = 0;
    while( true ) {
      iVar1 = Vec_IntSize(p->vCis);
      bVar5 = false;
      if (local_4c < iVar1) {
        _iLitNew = Gia_ManCi(p,local_4c);
        bVar5 = _iLitNew != (Gia_Obj_t *)0x0;
      }
      if (!bVar5) break;
      uVar2 = Gia_ManAppendCi(p_00);
      _iLitNew->Value = uVar2;
      local_4c = local_4c + 1;
    }
    local_4c = 0;
    while( true ) {
      iVar1 = Gia_ManRegNum(p);
      bVar5 = false;
      if (local_4c < iVar1) {
        iVar1 = Gia_ManPiNum(p);
        _iLitNew = Gia_ManCi(p,iVar1 + local_4c);
        bVar5 = _iLitNew != (Gia_Obj_t *)0x0;
      }
      if (!bVar5) break;
      Gia_ManSpecBuild(p_00,p,_iLitNew,vXorLits_00,0,1,vTrace,(Vec_Int_t *)0x0,vMap);
      local_4c = local_4c + 1;
    }
    local_4c = 0;
    while( true ) {
      iVar1 = Vec_IntSize(p->vCos);
      bVar5 = false;
      if (local_4c < iVar1) {
        _iLitNew = Gia_ManCo(p,local_4c);
        bVar5 = _iLitNew != (Gia_Obj_t *)0x0;
      }
      if (!bVar5) break;
      pGVar4 = Gia_ObjFanin0(_iLitNew);
      Gia_ManSpecReduce_rec(p_00,p,pGVar4,vXorLits_00,0,1,vTrace,(Vec_Int_t *)0x0,vMap);
      local_4c = local_4c + 1;
    }
    local_4c = 0;
    while( true ) {
      iVar1 = Gia_ManPoNum(p);
      bVar5 = false;
      if (local_4c < iVar1) {
        _iLitNew = Gia_ManCo(p,local_4c);
        bVar5 = _iLitNew != (Gia_Obj_t *)0x0;
      }
      if (!bVar5) break;
      iVar1 = Gia_ObjFanin0Copy(_iLitNew);
      Gia_ManAppendCo(p_00,iVar1);
      local_4c = local_4c + 1;
    }
    for (local_4c = 0; iVar1 = Vec_IntSize(vXorLits_00), local_4c < iVar1; local_4c = local_4c + 1)
    {
      iVar1 = Vec_IntEntry(vXorLits_00,local_4c);
      Gia_ManAppendCo(p_00,iVar1);
    }
    iVar1 = Vec_IntSize(vXorLits_00);
    if (iVar1 == 0) {
      Abc_Print(1,"Speculatively reduced model has no primary outputs.\n");
      Gia_ManAppendCo(p_00,0);
    }
    local_4c = 0;
    while( true ) {
      iVar1 = Gia_ManRegNum(p);
      bVar5 = false;
      if (local_4c < iVar1) {
        iVar1 = Gia_ManPoNum(p);
        _iLitNew = Gia_ManCo(p,iVar1 + local_4c);
        bVar5 = _iLitNew != (Gia_Obj_t *)0x0;
      }
      if (!bVar5) break;
      iVar1 = Gia_ObjFanin0Copy(_iLitNew);
      Gia_ManAppendCo(p_00,iVar1);
      local_4c = local_4c + 1;
    }
    Gia_ManHashStop(p_00);
    Vec_IntFree(vXorLits_00);
    iVar1 = Gia_ManRegNum(p);
    Gia_ManSetRegNum(p_00,iVar1);
    p_local = Gia_ManCleanup(p_00);
    Gia_ManStop(p_00);
  }
  return p_local;
}

Assistant:

Gia_Man_t * Gia_ManSpecReduceTrace( Gia_Man_t * p, Vec_Int_t * vTrace, Vec_Int_t * vMap )
{
    Vec_Int_t * vXorLits;
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;
    int i, iLitNew;
    if ( !p->pReprs )
    {
        Abc_Print( 1, "Gia_ManSpecReduce(): Equivalence classes are not available.\n" );
        return NULL;
    }
    Vec_IntClear( vTrace );
    vXorLits = Vec_IntAlloc( 1000 );
    Gia_ManSetPhase( p );
    Gia_ManFillValue( p );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManHashAlloc( pNew );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    Gia_ManForEachRo( p, pObj, i )
        Gia_ManSpecBuild( pNew, p, pObj, vXorLits, 0, 1, vTrace, NULL, vMap );
    Gia_ManForEachCo( p, pObj, i )
        Gia_ManSpecReduce_rec( pNew, p, Gia_ObjFanin0(pObj), vXorLits, 0, 1, vTrace, NULL, vMap );
    Gia_ManForEachPo( p, pObj, i )
        Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Vec_IntForEachEntry( vXorLits, iLitNew, i )
        Gia_ManAppendCo( pNew, iLitNew );
    if ( Vec_IntSize(vXorLits) == 0 )
    {
        Abc_Print( 1, "Speculatively reduced model has no primary outputs.\n" );
        Gia_ManAppendCo( pNew, 0 );
    }
    Gia_ManForEachRi( p, pObj, i )
        Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManHashStop( pNew );
    Vec_IntFree( vXorLits );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}